

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O2

void modifier_set_encoding(png_modifier *pm)

{
  uint uVar1;
  uint uVar2;
  color_encoding *pcVar3;
  ulong uVar4;
  double dVar5;
  
  pm->current_gamma = 0.0;
  pm->current_encoding = (color_encoding *)0x0;
  pm->encoding_ignored = 0;
  uVar1 = pm->encoding_counter;
  if (uVar1 != 0) {
    uVar2 = uVar1 - pm->ngammas;
    if (uVar1 < pm->ngammas || uVar2 == 0) {
      pm->current_gamma = 1.0 / pm->gammas[uVar1 - 1];
      return;
    }
    if (uVar2 < pm->nencodings) {
      pcVar3 = pm->encodings;
      uVar4 = (ulong)uVar2;
      dVar5 = pcVar3[uVar4].gamma;
    }
    else {
      uVar4 = (ulong)uVar2 % (ulong)pm->nencodings;
      pcVar3 = pm->encodings;
      dVar5 = 1.0;
    }
    pm->current_gamma = dVar5;
    pm->current_encoding = pcVar3 + uVar4;
  }
  return;
}

Assistant:

static void
modifier_set_encoding(png_modifier *pm)
{
   /* Set the encoding to the one specified by the current encoding counter,
    * first clear out all the settings - this corresponds to an encoding_counter
    * of 0.
    */
   pm->current_gamma = 0;
   pm->current_encoding = 0;
   pm->encoding_ignored = 0; /* not ignored yet - happens in _ini functions. */

   /* Now, if required, set the gamma and encoding fields. */
   if (pm->encoding_counter > 0)
   {
      /* The gammas[] array is an array of screen gammas, not encoding gammas,
       * so we need the inverse:
       */
      if (pm->encoding_counter <= pm->ngammas)
         pm->current_gamma = 1/pm->gammas[pm->encoding_counter-1];

      else
      {
         unsigned int i = pm->encoding_counter - pm->ngammas;

         if (i >= pm->nencodings)
         {
            i %= pm->nencodings;
            pm->current_gamma = 1; /* Linear, only in the 16 bit case */
         }

         else
            pm->current_gamma = pm->encodings[i].gamma;

         pm->current_encoding = pm->encodings + i;
      }
   }
}